

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LennardJonesAdapter.cpp
# Opt level: O0

void __thiscall
OpenMD::LennardJonesAdapter::makeLennardJones
          (LennardJonesAdapter *this,RealType sigma,RealType epsilon,bool isSoft)

{
  bool bVar1;
  shared_ptr<OpenMD::GenericData> *in_RDI;
  AtomType *unaff_retaddr;
  LJAtypeParameters ljParam;
  string *in_stack_ffffffffffffff78;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::LJAtypeParameters>_> *__r;
  AtomType *in_stack_ffffffffffffff80;
  element_type *this_00;
  LJAtypeParameters *in_stack_ffffffffffffffa0;
  element_type *in_stack_ffffffffffffffa8;
  shared_ptr<OpenMD::GenericData> *genData;
  
  genData = in_RDI;
  bVar1 = isLennardJones((LennardJonesAdapter *)0x2b0746);
  if (bVar1) {
    AtomType::removeProperty(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  this_00 = (in_RDI->super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  __r = (shared_ptr<OpenMD::SimpleTypeData<OpenMD::LJAtypeParameters>_> *)&stack0xffffffffffffffa8;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::LJAtypeParameters>,std::__cxx11::string_const&,OpenMD::LJAtypeParameters&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::shared_ptr<OpenMD::GenericData>::
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::LJAtypeParameters>,void>
            ((shared_ptr<OpenMD::GenericData> *)this_00,__r);
  AtomType::addProperty(unaff_retaddr,genData);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x2b07e9);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::LJAtypeParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::LJAtypeParameters>_> *)0x2b07f3);
  return;
}

Assistant:

void LennardJonesAdapter::makeLennardJones(RealType sigma, RealType epsilon,
                                             bool isSoft) {
    if (isLennardJones()) { at_->removeProperty(LJtypeID); }

    LJAtypeParameters ljParam {};
    ljParam.epsilon = epsilon;
    ljParam.sigma   = sigma;
    ljParam.isSoft  = isSoft;

    at_->addProperty(std::make_shared<LJAtypeData>(LJtypeID, ljParam));
  }